

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_wbuf.c
# Opt level: O0

void lj_wbuf_addn(lj_wbuf *buf,void *src,size_t n)

{
  int iVar1;
  size_t __n;
  lj_wbuf *in_RDX;
  void *in_RSI;
  lj_wbuf *in_RDI;
  size_t left;
  void *local_40;
  
  iVar1 = lj_wbuf_test_flag(in_RDI,'\x02');
  local_40 = in_RSI;
  if (iVar1 == 0) {
    for (; (lj_wbuf *)in_RDI->size < in_RDX; in_RDX = (lj_wbuf *)((long)in_RDX - __n)) {
      __n = in_RDI->size - ((long)in_RDI->pos - (long)in_RDI->buf);
      memcpy(in_RDI->pos,local_40,__n);
      in_RDI->pos = in_RDI->pos + __n;
      lj_wbuf_flush(in_RDX);
      local_40 = (void *)((long)local_40 + __n);
    }
    if ((lj_wbuf *)(in_RDI->size - ((long)in_RDI->pos - (long)in_RDI->buf)) < in_RDX) {
      lj_wbuf_flush(in_RDX);
    }
    memcpy(in_RDI->pos,local_40,(size_t)in_RDX);
    in_RDI->pos = in_RDI->pos + (long)&in_RDX->writer;
  }
  return;
}

Assistant:

void lj_wbuf_addn(struct lj_wbuf *buf, const void *src, size_t n)
{
  if (LJ_UNLIKELY(lj_wbuf_test_flag(buf, STREAM_STOP)))
    return;
  /*
  ** Very unlikely: We are told to write a large buffer at once.
  ** Buffer doesn't belong to us so we must to pump data
  ** through the buffer.
  */
  while (LJ_UNLIKELY(n > buf->size)) {
    const size_t left = wbuf_left(buf);
    memcpy(buf->pos, src, left);
    buf->pos += (ptrdiff_t)left;
    lj_wbuf_flush(buf);
    src = (uint8_t *)src + (ptrdiff_t)left;
    n -= left;
  }

  wbuf_reserve(buf, n);
  memcpy(buf->pos, src, n);
  buf->pos += (ptrdiff_t)n;
}